

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O1

int __thiscall
duckdb::Interpolator<false>::
Operation<unsigned_long,int,duckdb::QuantileComposed<duckdb::MadAccessor<int,int,int>,duckdb::QuantileIndirect<int>>>
          (Interpolator<false> *this,unsigned_long *v_t,Vector *result,
          QuantileComposed<duckdb::MadAccessor<int,_int,_int>,_duckdb::QuantileIndirect<int>_>
          *accessor)

{
  idx_t iVar1;
  idx_t iVar2;
  idx_t iVar3;
  long lVar4;
  _Iter_comp_iter<duckdb::QuantileCompare<duckdb::QuantileComposed<duckdb::MadAccessor<int,_int,_int>,_duckdb::QuantileIndirect<int>_>_>_>
  __comp;
  _Iter_comp_iter<duckdb::QuantileCompare<duckdb::QuantileComposed<duckdb::MadAccessor<int,_int,_int>,_duckdb::QuantileIndirect<int>_>_>_>
  __comp_00;
  _Iter_comp_iter<duckdb::QuantileCompare<duckdb::QuantileComposed<duckdb::MadAccessor<int,_int,_int>,_duckdb::QuantileIndirect<int>_>_>_>
  __comp_01;
  int iVar5;
  bool bVar6;
  uint uVar7;
  ulong uVar8;
  undefined1 auVar9 [12];
  int result_1;
  int local_54;
  string local_50;
  
  bVar6 = this->desc;
  iVar1 = this->FRN;
  iVar2 = this->begin;
  iVar3 = this->end;
  local_50._M_dataplus._M_p = (pointer)accessor;
  local_50._M_string_length = (size_type)accessor;
  local_50.field_2._M_local_buf[0] = bVar6;
  if (this->CRN == iVar1) {
    if (iVar1 != iVar3 && iVar2 != iVar3) {
      uVar8 = (long)(iVar3 * 8 + iVar2 * -8) >> 3;
      lVar4 = 0x3f;
      if (uVar8 != 0) {
        for (; uVar8 >> lVar4 == 0; lVar4 = lVar4 + -1) {
        }
      }
      __comp._M_comp._17_7_ = local_50.field_2._M_allocated_capacity._1_7_;
      __comp._M_comp.desc = bVar6;
      __comp._M_comp.accessor_r = accessor;
      __comp._M_comp.accessor_l = accessor;
      std::
      __introselect<unsigned_long*,long,__gnu_cxx::__ops::_Iter_comp_iter<duckdb::QuantileCompare<duckdb::QuantileComposed<duckdb::MadAccessor<int,int,int>,duckdb::QuantileIndirect<int>>>>>
                (v_t + iVar2,v_t + iVar1,v_t + iVar3,(ulong)(((uint)lVar4 ^ 0x3f) * 2) ^ 0x7e,__comp
                );
    }
    uVar7 = QuantileComposed<duckdb::MadAccessor<int,_int,_int>,_duckdb::QuantileIndirect<int>_>::
            operator()(accessor,v_t + this->FRN);
    bVar6 = duckdb::TryCast::Operation<int,int>(uVar7,&local_54,false);
    if (!bVar6) {
      auVar9 = __cxa_allocate_exception(0x10);
      CastExceptionText<int,int>(&local_50,(duckdb *)(ulong)uVar7,auVar9._8_4_);
      duckdb::InvalidInputException::InvalidInputException(auVar9._0_8_,(string *)&local_50);
      __cxa_throw(auVar9._0_8_,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  else {
    if (iVar1 != iVar3 && iVar2 != iVar3) {
      uVar8 = (long)(iVar3 * 8 + iVar2 * -8) >> 3;
      lVar4 = 0x3f;
      if (uVar8 != 0) {
        for (; uVar8 >> lVar4 == 0; lVar4 = lVar4 + -1) {
        }
      }
      __comp_00._M_comp._17_7_ = local_50.field_2._M_allocated_capacity._1_7_;
      __comp_00._M_comp.desc = bVar6;
      __comp_00._M_comp.accessor_r = accessor;
      __comp_00._M_comp.accessor_l = accessor;
      std::
      __introselect<unsigned_long*,long,__gnu_cxx::__ops::_Iter_comp_iter<duckdb::QuantileCompare<duckdb::QuantileComposed<duckdb::MadAccessor<int,int,int>,duckdb::QuantileIndirect<int>>>>>
                (v_t + iVar2,v_t + iVar1,v_t + iVar3,(ulong)(((uint)lVar4 ^ 0x3f) * 2) ^ 0x7e,
                 __comp_00);
    }
    iVar1 = this->FRN;
    iVar2 = this->end;
    local_50._M_dataplus._M_p = (pointer)accessor;
    local_50._M_string_length = (size_type)accessor;
    local_50.field_2._M_local_buf[0] = bVar6;
    if (this->CRN != iVar2 && iVar1 != iVar2) {
      uVar8 = (long)(iVar2 * 8 + iVar1 * -8) >> 3;
      lVar4 = 0x3f;
      if (uVar8 != 0) {
        for (; uVar8 >> lVar4 == 0; lVar4 = lVar4 + -1) {
        }
      }
      __comp_01._M_comp._17_7_ = local_50.field_2._M_allocated_capacity._1_7_;
      __comp_01._M_comp.desc = bVar6;
      __comp_01._M_comp.accessor_r = accessor;
      __comp_01._M_comp.accessor_l = accessor;
      std::
      __introselect<unsigned_long*,long,__gnu_cxx::__ops::_Iter_comp_iter<duckdb::QuantileCompare<duckdb::QuantileComposed<duckdb::MadAccessor<int,int,int>,duckdb::QuantileIndirect<int>>>>>
                (v_t + iVar1,v_t + this->CRN,v_t + iVar2,(ulong)(((uint)lVar4 ^ 0x3f) * 2) ^ 0x7e,
                 __comp_01);
    }
    uVar7 = QuantileComposed<duckdb::MadAccessor<int,_int,_int>,_duckdb::QuantileIndirect<int>_>::
            operator()(accessor,v_t + this->FRN);
    bVar6 = duckdb::TryCast::Operation<int,int>(uVar7,&local_54,false);
    iVar5 = local_54;
    if (!bVar6) {
      auVar9 = __cxa_allocate_exception(0x10);
      CastExceptionText<int,int>(&local_50,(duckdb *)(ulong)uVar7,auVar9._8_4_);
      duckdb::InvalidInputException::InvalidInputException(auVar9._0_8_,(string *)&local_50);
      __cxa_throw(auVar9._0_8_,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
    }
    uVar7 = QuantileComposed<duckdb::MadAccessor<int,_int,_int>,_duckdb::QuantileIndirect<int>_>::
            operator()(accessor,v_t + this->CRN);
    bVar6 = duckdb::TryCast::Operation<int,int>(uVar7,&local_54,false);
    if (!bVar6) {
      auVar9 = __cxa_allocate_exception(0x10);
      CastExceptionText<int,int>(&local_50,(duckdb *)(ulong)uVar7,auVar9._8_4_);
      duckdb::InvalidInputException::InvalidInputException(auVar9._0_8_,(string *)&local_50);
      __cxa_throw(auVar9._0_8_,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
    }
    local_54 = (int)((double)(local_54 - iVar5) *
                     (this->RN -
                     (((double)CONCAT44(0x45300000,(int)(this->FRN >> 0x20)) -
                      1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)this->FRN) - 4503599627370496.0))) +
                    (double)iVar5);
  }
  return local_54;
}

Assistant:

TARGET_TYPE Operation(INPUT_TYPE *v_t, Vector &result, const ACCESSOR &accessor = ACCESSOR()) const {
		using ACCESS_TYPE = typename ACCESSOR::RESULT_TYPE;
		QuantileCompare<ACCESSOR> comp(accessor, desc);
		if (CRN == FRN) {
			std::nth_element(v_t + begin, v_t + FRN, v_t + end, comp);
			return CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(v_t[FRN]), result);
		} else {
			std::nth_element(v_t + begin, v_t + FRN, v_t + end, comp);
			std::nth_element(v_t + FRN, v_t + CRN, v_t + end, comp);
			auto lo = CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(v_t[FRN]), result);
			auto hi = CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(v_t[CRN]), result);
			return CastInterpolation::Interpolate<TARGET_TYPE>(lo, RN - FRN, hi);
		}
	}